

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_getCCSID_63(UConverter *converter,UErrorCode *err)

{
  UBool UVar1;
  char *pcVar2;
  long lVar3;
  char *ccsidStr;
  char *standardName;
  int32_t ccsid;
  UErrorCode *err_local;
  UConverter *converter_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    standardName._4_4_ = converter->sharedData->staticData->codepage;
    if (standardName._4_4_ == 0) {
      pcVar2 = ucnv_getName_63(converter,err);
      pcVar2 = ucnv_getStandardName_63(pcVar2,"IBM",err);
      UVar1 = U_SUCCESS(*err);
      if (((UVar1 != '\0') && (pcVar2 != (char *)0x0)) &&
         (pcVar2 = strchr(pcVar2,0x2d), pcVar2 != (char *)0x0)) {
        lVar3 = atol(pcVar2 + 1);
        standardName._4_4_ = (int)lVar3;
      }
    }
    converter_local._4_4_ = standardName._4_4_;
  }
  else {
    converter_local._4_4_ = -1;
  }
  return converter_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_getCCSID(const UConverter * converter,
              UErrorCode * err)
{
    int32_t ccsid;
    if (U_FAILURE (*err))
        return -1;

    ccsid = converter->sharedData->staticData->codepage;
    if (ccsid == 0) {
        /* Rare case. This is for cases like gb18030,
        which doesn't have an IBM canonical name, but does have an IBM alias. */
        const char *standardName = ucnv_getStandardName(ucnv_getName(converter, err), "IBM", err);
        if (U_SUCCESS(*err) && standardName) {
            const char *ccsidStr = uprv_strchr(standardName, '-');
            if (ccsidStr) {
                ccsid = (int32_t)atol(ccsidStr+1);  /* +1 to skip '-' */
            }
        }
    }
    return ccsid;
}